

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

int test_layer<ncnn::ReLU>
              (char *layer_type,ParamDict *pd,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *weights
              ,Option *_opt,Mat *a,float epsilon,_func_void_ReLU_ptr *func)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  int *piVar9;
  undefined8 uVar10;
  undefined8 uVar13;
  undefined8 uVar16;
  int iVar19;
  long lVar20;
  pointer pMVar21;
  ulong uVar22;
  Option *opt;
  long lVar23;
  float fVar24;
  float fVar25;
  Mat top_shape;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights_fp16;
  _func_void_ReLU_ptr *p_Var26;
  Mat local_188;
  int local_140;
  float local_13c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_138;
  Mat local_118;
  Mat *local_d0;
  char *local_c8;
  ParamDict *local_c0;
  _func_void_ReLU_ptr *local_b8;
  long local_b0;
  Option local_a8;
  undefined8 local_80;
  Allocator *pAStack_78;
  Allocator *local_70;
  undefined4 uStack_68;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined1 local_60;
  undefined2 uStack_5f;
  undefined1 uStack_5d;
  undefined8 local_58;
  Allocator *pAStack_50;
  Allocator *local_48;
  uint6 uStack_40;
  undefined2 uStack_3a;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined2 uStack_36;
  undefined2 uVar5;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar18;
  
  lVar23 = 0;
  local_c8 = layer_type;
  local_c0 = pd;
  local_b8 = func;
  do {
    ncnn::Option::Option((Option *)(&local_a8.lightmode + lVar23));
    lVar23 = lVar23 + 0x28;
  } while (lVar23 != 0x78);
  uVar1 = _opt->use_int8_arithmetic;
  uVar6 = _opt->use_bf16_storage;
  local_a8.lightmode = _opt->lightmode;
  local_a8._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_a8.num_threads = _opt->num_threads;
  local_a8.blob_allocator = _opt->blob_allocator;
  local_a8.workspace_allocator = _opt->workspace_allocator;
  uVar10._0_1_ = _opt->use_winograd_convolution;
  uVar10._1_1_ = _opt->use_sgemm_convolution;
  uVar10._2_1_ = _opt->use_int8_inference;
  uVar10._3_1_ = _opt->use_vulkan_compute;
  uVar10._4_1_ = _opt->use_fp16_packed;
  uVar10._5_1_ = _opt->use_fp16_storage;
  uVar11 = _opt->use_fp16_arithmetic;
  uVar12 = _opt->use_int8_storage;
  uVar10._6_2_ = CONCAT11(uVar12,uVar11);
  local_a8._33_2_ = 0;
  local_a8.use_int8_arithmetic = (bool)uVar1;
  local_a8.use_bf16_storage = (bool)uVar6;
  local_a8._24_4_ = SUB84(uVar10,0);
  local_a8._28_2_ = 0;
  local_a8._30_2_ = uVar10._6_2_;
  uVar2 = _opt->use_int8_arithmetic;
  uVar7 = _opt->use_bf16_storage;
  uVar13._0_1_ = _opt->use_winograd_convolution;
  uVar13._1_1_ = _opt->use_sgemm_convolution;
  uVar13._2_1_ = _opt->use_int8_inference;
  uVar13._3_1_ = _opt->use_vulkan_compute;
  uVar13._4_1_ = _opt->use_fp16_packed;
  uVar13._5_1_ = _opt->use_fp16_storage;
  uVar14 = _opt->use_fp16_arithmetic;
  uVar15 = _opt->use_int8_storage;
  uVar13._6_2_ = CONCAT11(uVar15,uVar14);
  local_70 = _opt->workspace_allocator;
  local_80._0_1_ = _opt->lightmode;
  local_80._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_80._4_4_ = _opt->num_threads;
  pAStack_78 = _opt->blob_allocator;
  _local_60 = CONCAT13(uVar7,CONCAT21(0x101,uVar2));
  _uStack_68 = CONCAT26(uVar13._6_2_,CONCAT24(1,(int)uVar13));
  uVar3 = _opt->use_int8_arithmetic;
  uVar4 = _opt->use_shader_pack8;
  uVar8 = _opt->use_bf16_storage;
  uVar5 = CONCAT11(uVar8,uVar4);
  uVar16._0_1_ = _opt->use_winograd_convolution;
  uVar16._1_1_ = _opt->use_sgemm_convolution;
  uVar16._2_1_ = _opt->use_int8_inference;
  uVar16._3_1_ = _opt->use_vulkan_compute;
  uVar16._4_1_ = _opt->use_fp16_packed;
  uVar16._5_1_ = _opt->use_fp16_storage;
  uVar17 = _opt->use_fp16_arithmetic;
  uVar18 = _opt->use_int8_storage;
  uVar16._6_2_ = CONCAT11(uVar18,uVar17);
  local_48 = _opt->workspace_allocator;
  local_58._0_1_ = _opt->lightmode;
  local_58._1_3_ = *(undefined3 *)&_opt->field_0x1;
  local_58._4_4_ = _opt->num_threads;
  pAStack_50 = _opt->blob_allocator;
  _local_38 = CONCAT22(uVar5,CONCAT11(1,uVar3));
  uStack_40 = (uint6)(uint3)uVar16;
  _uStack_40 = CONCAT26(uVar16._6_2_,uStack_40);
  _local_38 = CONCAT13(1,_local_38);
  fVar24 = epsilon * 100.0;
  lVar23 = 0;
  local_d0 = a;
  while( true ) {
    opt = &local_a8 + lVar23;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.h = 0;
    local_118.c = 0;
    local_118.cstep = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_138.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fVar25 = fVar24;
    local_b0 = lVar23;
    if (((&local_a8)[lVar23].use_fp16_packed == false) &&
       ((&local_a8)[lVar23].use_fp16_storage != true)) {
      if ((&local_a8)[lVar23].use_bf16_storage == true) {
        local_188.elemsize._0_4_ = 0;
        local_188._20_8_ = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.h = 0;
        local_188.c = 0;
        local_188.cstep = 0;
        local_188.allocator = (Allocator *)0x0;
        local_188.dims = 0;
        local_188.w = 0;
        ncnn::cast_float32_to_bfloat16(a,&local_188,opt);
        ncnn::cast_bfloat16_to_float32(&local_188,&local_118,opt);
        piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (**(code **)(*(long *)local_188.allocator + 0x18))();
            }
          }
        }
        local_188.elemsize._0_4_ = 0;
        local_188._20_8_ = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.dims = 0;
        local_188.w = 0;
        local_188.h = 0;
        local_188.c = 0;
        local_188.cstep = 0;
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                  (&local_138,
                   (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 6);
        pMVar21 = (weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar21) {
          lVar20 = 0;
          uVar22 = 0;
          do {
            local_188.elemsize._0_4_ = 0;
            local_188._20_8_ = 0;
            local_188.data = (void *)0x0;
            local_188.refcount._0_4_ = 0;
            local_188.refcount._4_4_ = 0;
            local_188.h = 0;
            local_188.c = 0;
            local_188.cstep = 0;
            local_188.allocator = (Allocator *)0x0;
            local_188.dims = 0;
            local_188.w = 0;
            ncnn::cast_float32_to_bfloat16((Mat *)((long)&pMVar21->data + lVar20),&local_188,opt);
            ncnn::cast_bfloat16_to_float32
                      (&local_188,
                       (Mat *)((long)&(local_138.
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                       _M_impl.super__Vector_impl_data._M_start)->data + lVar20),opt
                      );
            piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
            if (piVar9 != (int *)0x0) {
              LOCK();
              *piVar9 = *piVar9 + -1;
              UNLOCK();
              if (*piVar9 == 0) {
                if (local_188.allocator == (Allocator *)0x0) {
                  if (local_188.data != (void *)0x0) {
                    free(local_188.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_188.allocator + 0x18))();
                }
              }
            }
            uVar22 = uVar22 + 1;
            pMVar21 = (weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            lVar20 = lVar20 + 0x40;
            a = local_d0;
          } while (uVar22 < (ulong)((long)(weights->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar21
                                   >> 6));
        }
      }
      else {
        if (&local_118 != a) {
          piVar9 = a->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          local_118.data = a->data;
          local_118.refcount._0_4_ = SUB84(a->refcount,0);
          local_118.refcount._4_4_ = (undefined4)((ulong)a->refcount >> 0x20);
          local_118.elemsize._0_4_ = (undefined4)a->elemsize;
          local_118.elemsize._4_4_ = (undefined4)(a->elemsize >> 0x20);
          local_118.elempack = a->elempack;
          local_118.allocator = a->allocator;
          local_118.dims = a->dims;
          local_118.w = a->w;
          local_118.h = a->h;
          local_118.c = a->c;
          local_118.cstep = a->cstep;
        }
        local_138.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_138.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator=(&local_138,weights);
        fVar25 = epsilon;
      }
    }
    else {
      local_188.elemsize._0_4_ = 0;
      local_188._20_8_ = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.h = 0;
      local_188.c = 0;
      local_188.cstep = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      ncnn::cast_float32_to_float16(a,&local_188,opt);
      ncnn::cast_float16_to_float32(&local_188,&local_118,opt);
      piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (**(code **)(*(long *)local_188.allocator + 0x18))();
          }
        }
      }
      local_188.elemsize._0_4_ = 0;
      local_188._20_8_ = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.c = 0;
      local_188.cstep = 0;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                (&local_138,
                 (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 6);
      pMVar21 = (weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar21) {
        lVar20 = 0;
        uVar22 = 0;
        do {
          local_188.elemsize._0_4_ = 0;
          local_188._20_8_ = 0;
          local_188.data = (void *)0x0;
          local_188.refcount._0_4_ = 0;
          local_188.refcount._4_4_ = 0;
          local_188.h = 0;
          local_188.c = 0;
          local_188.cstep = 0;
          local_188.allocator = (Allocator *)0x0;
          local_188.dims = 0;
          local_188.w = 0;
          ncnn::cast_float32_to_float16((Mat *)((long)&pMVar21->data + lVar20),&local_188,opt);
          ncnn::cast_float16_to_float32
                    (&local_188,
                     (Mat *)((long)&(local_138.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->data + lVar20),opt);
          piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (*piVar9 == 0) {
              if (local_188.allocator == (Allocator *)0x0) {
                if (local_188.data != (void *)0x0) {
                  free(local_188.data);
                }
              }
              else {
                (**(code **)(*(long *)local_188.allocator + 0x18))();
              }
            }
          }
          uVar22 = uVar22 + 1;
          pMVar21 = (weights->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar20 = lVar20 + 0x40;
          a = local_d0;
        } while (uVar22 < (ulong)((long)(weights->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar21 >>
                                 6));
      }
    }
    local_188.elemsize._0_4_ = 0;
    local_188._20_8_ = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.h = 0;
    local_188.c = 0;
    local_188.cstep = 0;
    local_188.allocator = (Allocator *)0x0;
    local_188.dims = 0;
    local_188.w = 0;
    local_13c = fVar25;
    iVar19 = ncnn::layer_to_index(local_c8);
    p_Var26 = local_b8;
    iVar19 = test_layer<ncnn::ReLU>
                       (iVar19,local_c0,&local_138,opt,&local_118,&local_188,local_13c,local_b8);
    if (iVar19 != 0) {
      fprintf(_stderr,
              "test_layer %s failed use_packing_layout=%d use_fp16_packed=%d use_shader_pack8=%d use_bf16_storage=%d\n"
              ,local_c8,(ulong)(&local_a8)[lVar23].use_packing_layout,
              (ulong)(&local_a8)[lVar23].use_fp16_packed,(ulong)(&local_a8)[lVar23].use_shader_pack8
              ,CONCAT44((int)((ulong)p_Var26 >> 0x20),(uint)(&local_a8)[lVar23].use_bf16_storage));
      local_140 = iVar19;
    }
    piVar9 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_188.allocator == (Allocator *)0x0) {
          if (local_188.data != (void *)0x0) {
            free(local_188.data);
          }
        }
        else {
          (**(code **)(*(long *)local_188.allocator + 0x18))();
        }
      }
    }
    local_188.elemsize._0_4_ = 0;
    local_188._20_8_ = 0;
    local_188.data = (void *)0x0;
    local_188.refcount._0_4_ = 0;
    local_188.refcount._4_4_ = 0;
    local_188.dims = 0;
    local_188.w = 0;
    local_188.h = 0;
    local_188.c = 0;
    local_188.cstep = 0;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_138);
    piVar9 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (**(code **)(*(long *)local_118.allocator + 0x18))();
        }
      }
    }
    if (iVar19 != 0) break;
    lVar23 = local_b0 + 1;
    if (lVar23 == 3) {
      return 0;
    }
  }
  return local_140;
}

Assistant:

int test_layer(const char* layer_type, const ncnn::ParamDict& pd, const std::vector<ncnn::Mat>& weights, const ncnn::Option& _opt, const ncnn::Mat& a, float epsilon = 0.001, void (*func)(T*) = 0)
{
    ncnn::Option opts[3];
    opts[0] = _opt;
    opts[0].use_packing_layout = false;
    opts[0].use_fp16_packed = false;
    opts[0].use_fp16_storage = false;
    opts[0].use_shader_pack8 = false;
    opts[1] = _opt;
    opts[1].use_packing_layout = true;
    opts[1].use_fp16_packed = true;
    opts[1].use_fp16_storage = false;
    opts[1].use_shader_pack8 = true;
    opts[2] = _opt;
    opts[2].use_packing_layout = true;
    opts[2].use_vulkan_compute = false;
    opts[2].use_fp16_packed = false;
    opts[2].use_fp16_storage = false;
    opts[2].use_bf16_storage = true;

    for (int i = 0; i < 3; i++)
    {
        const ncnn::Option& opt = opts[i];

        // fp16 representation
        ncnn::Mat a_fp16;
        std::vector<ncnn::Mat> weights_fp16;
        float epsilon_fp16;
        if (opt.use_fp16_packed || opt.use_fp16_storage)
        {
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_float16(a, tmp, opt);
                ncnn::cast_float16_to_float32(tmp, a_fp16, opt);
            }
            weights_fp16.resize(weights.size());
            for (size_t j = 0; j < weights.size(); j++)
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_float16(weights[j], tmp, opt);
                ncnn::cast_float16_to_float32(tmp, weights_fp16[j], opt);
            }
            epsilon_fp16 = epsilon * 100;// 0.1
        }
        else if (opt.use_bf16_storage)
        {
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_bfloat16(a, tmp, opt);
                ncnn::cast_bfloat16_to_float32(tmp, a_fp16, opt);
            }
            weights_fp16.resize(weights.size());
            for (size_t j = 0; j < weights.size(); j++)
            {
                ncnn::Mat tmp;
                ncnn::cast_float32_to_bfloat16(weights[j], tmp, opt);
                ncnn::cast_bfloat16_to_float32(tmp, weights_fp16[j], opt);
            }
            epsilon_fp16 = epsilon * 100;// 0.1
        }
        else
        {
            a_fp16 = a;
            weights_fp16 = weights;
            epsilon_fp16 = epsilon;
        }

        ncnn::Mat top_shape;
        int ret = test_layer<T>(ncnn::layer_to_index(layer_type), pd, weights_fp16, opt, a_fp16, top_shape, epsilon_fp16, func);
        if (ret != 0)
        {
            fprintf(stderr, "test_layer %s failed use_packing_layout=%d use_fp16_packed=%d use_shader_pack8=%d use_bf16_storage=%d\n", layer_type, opt.use_packing_layout, opt.use_fp16_packed, opt.use_shader_pack8, opt.use_bf16_storage);
            return ret;
        }
    }

    return 0;
}